

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>_>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>_>_>
         *this)

{
  double *pdVar1;
  bool *pbVar2;
  undefined8 *puVar3;
  _Base_ptr p_Var4;
  ostringstream *poVar5;
  _Rb_tree_node_base *p_Var6;
  Precision PVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Matrix<float,_3,_3>_> *pVVar11;
  pointer pcVar12;
  double dVar13;
  pointer pMVar14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  undefined8 uVar19;
  Interval *pIVar20;
  IVal *pIVar21;
  undefined8 *puVar22;
  Vector<float,_3> *ival;
  undefined1 *puVar23;
  Matrix<float,_3,_3> *val;
  int row;
  long lVar24;
  FloatFormat *pFVar25;
  long lVar26;
  _Base_ptr p_Var27;
  long lVar28;
  string *msg;
  TestStatus *pTVar29;
  IVal in2;
  IVal in3;
  Environment env;
  FloatFormat highpFmt;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>_>_>
  outputs;
  IVal in0;
  IVal in1;
  void *outputArr [2];
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ResultCollector status;
  FuncSet funcs;
  ostringstream oss;
  deUint32 in_stack_fffffffffffff938;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>_>_>
  *pBVar30;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>_>_>
  *pBVar31;
  string local_6c0;
  TestLog *local_6a0;
  size_t local_698;
  string local_690;
  ulong local_670;
  FloatFormat *local_668;
  TestStatus *local_660;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_658;
  FloatFormat local_628;
  long local_600;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>_>_>
  local_5f8;
  undefined1 local_5c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5b8;
  double local_5a8;
  Precision local_5a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_598;
  undefined4 local_590;
  ios_base local_558 [8];
  ios_base local_550 [272];
  undefined1 local_440 [16];
  undefined1 local_430 [208];
  pointer local_360;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_358;
  pointer local_2f8;
  pointer local_2f0;
  pointer local_2e8;
  pointer local_2e0;
  ResultCollector local_2d0;
  undefined1 local_280 [12];
  YesNoMaybe YStack_274;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Rb_tree_node_base *local_260;
  double local_258;
  undefined1 local_1a8 [376];
  
  this_00 = this->m_samplings;
  pFVar25 = &(this->m_caseCtx).floatFormat;
  PVar7 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  local_660 = __return_storage_ptr__;
  iVar17 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_668 = pFVar25;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Matrix<float,3,3>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_358,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Matrix<float,_3,_3>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar25,(FloatFormat *)(ulong)PVar7,(Precision)sVar8,(ulong)(iVar17 + 0xdeadbeef),
             in_stack_fffffffffffff938);
  pMVar14 = local_358.in0.
            super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_698 = ((long)local_358.in0.
                     super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_358.in0.
                     super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x71c71c71c71c71c7;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Matrix<float,_3,_3>,_tcu::Matrix<float,_3,_3>_>_>::
  Outputs(&local_5f8,local_698);
  local_628.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_628.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_628.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_628.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_628.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_628.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_628.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_628.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_628._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_658._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_658._M_impl.super__Rb_tree_header._M_header;
  local_658._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_658._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_658._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_658._M_impl.super__Rb_tree_header._M_header._M_right =
       local_658._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_2d0);
  local_6a0 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_2f8 = local_358.in0.
              super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2f0 = local_358.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2e8 = local_358.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2e0 = local_358.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_430._200_8_ =
       local_5f8.out0.
       super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_360 = local_5f8.out1.
              super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar5 = (ostringstream *)(local_5c8 + 8);
  local_5c8._0_8_ = local_6a0;
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_550);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var6 = (_Rb_tree_node_base *)(local_280 + 8);
  local_280._8_4_ = _S_red;
  local_270._M_allocated_capacity = 0;
  local_258 = 0.0;
  pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_270._8_8_ = p_Var6;
  local_260 = p_Var6;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_280);
  if ((_Rb_tree_node_base *)local_270._8_8_ != p_Var6) {
    uVar19 = local_270._8_8_;
    do {
      (**(code **)(**(long **)(uVar19 + 0x20) + 0x30))(*(long **)(uVar19 + 0x20),local_1a8);
      uVar19 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar19);
    } while ((_Rb_tree_node_base *)uVar19 != p_Var6);
  }
  pFVar25 = local_668;
  if (local_258 != 0.0) {
    poVar5 = (ostringstream *)(local_5c8 + 8);
    local_5c8._0_8_ = local_6a0;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,(char *)local_440._0_8_,local_440._8_8_);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((undefined1 *)local_440._0_8_ != local_430) {
      operator_delete((void *)local_440._0_8_,local_430._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_550);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_280);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  pSVar10 = (this->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  ival = (Vector<float,_3> *)(local_430 + 200);
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,local_698,&local_2f8,ival,0);
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_5c8);
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_1a8);
  tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_280);
  pBVar30 = this;
  Environment::bind<tcu::Matrix<float,3,3>>
            ((Environment *)&local_658,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.m_ptr,
             (IVal *)local_5c8);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_658,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_440);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_658,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_6c0);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_658,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_690);
  Environment::bind<tcu::Matrix<float,3,3>>
            ((Environment *)&local_658,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.m_ptr,
             (IVal *)local_1a8);
  Environment::bind<tcu::Matrix<float,3,3>>
            ((Environment *)&local_658,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.m_ptr,
             (IVal *)local_280);
  if (local_358.in0.
      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_finish == pMVar14) {
LAB_008f9b2a:
    poVar5 = (ostringstream *)(local_5c8 + 8);
    local_5c8._0_8_ = local_6a0;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"All ",4);
    pTVar29 = local_660;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_550);
    local_5c8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(local_5c8 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5c8,"Pass","");
    pTVar29->m_code = QP_TEST_RESULT_PASS;
    (pTVar29->m_description)._M_dataplus._M_p = (pointer)&(pTVar29->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar29->m_description,local_5c8._0_8_,
               (char *)(local_5c8._0_8_ + CONCAT44(local_5c8._12_4_,local_5c8._8_4_)));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_5c8 + 0x10)) goto LAB_008f9d0f;
    uVar19 = (_Base_ptr)
             CONCAT44(local_5b8._M_allocated_capacity._4_4_,local_5b8._M_allocated_capacity._0_4_);
    local_280._0_8_ = local_5c8._0_8_;
  }
  else {
    poVar5 = (ostringstream *)(local_5c8 + 8);
    local_600 = local_698 + (local_698 == 0);
    lVar28 = 0;
    local_670 = 0;
    do {
      tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_1a8);
      tcu::Matrix<tcu::Interval,_3,_3>::Matrix((Matrix<tcu::Interval,_3,_3> *)local_280);
      round<tcu::Matrix<float,3,3>>
                ((IVal *)local_440,(shaderexecutor *)pFVar25,
                 (FloatFormat *)
                 (local_358.in0.
                  super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar28),(Matrix<float,_3,_3> *)ival);
      ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                ((IVal *)local_5c8,pFVar25,(IVal *)local_440);
      pIVar20 = (Interval *)
                Environment::lookup<tcu::Matrix<float,3,3>>
                          ((Environment *)&local_658,
                           (pBVar30->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>
                           .m_ptr);
      puVar23 = local_5c8;
      lVar24 = 0;
      do {
        lVar26 = 0;
        do {
          *(undefined8 *)((long)&pIVar20->m_hi + lVar26) = *(undefined8 *)(puVar23 + lVar26 + 0x10);
          dVar13 = *(double *)((long)(puVar23 + lVar26) + 8);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)&pIVar20->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar26;
          *(undefined8 *)pbVar2 = *(undefined8 *)(puVar23 + lVar26);
          *(double *)(pbVar2 + 8) = dVar13;
          lVar26 = lVar26 + 0x48;
        } while (lVar26 != 0xd8);
        lVar24 = lVar24 + 1;
        pIVar20 = pIVar20 + 1;
        puVar23 = puVar23 + 0x18;
      } while (lVar24 != 3);
      pBVar31 = pBVar30;
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_658,
                 (pBVar30->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_658,
                 (pBVar30->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_658,
                 (pBVar30->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_5a0 = (pBVar30->m_caseCtx).precision;
      local_5a8 = pFVar25->m_maxValue;
      local_5c8._0_8_ = *(undefined8 *)pFVar25;
      local_5c8._8_4_ = pFVar25->m_fractionBits;
      local_5c8._12_4_ = pFVar25->m_hasSubnormal;
      local_5b8._M_allocated_capacity._0_4_ = pFVar25->m_hasInf;
      local_5b8._M_allocated_capacity._4_4_ = pFVar25->m_hasNaN;
      local_5b8._8_1_ = pFVar25->m_exactPrecision;
      local_5b8._9_3_ = *(undefined3 *)&pFVar25->field_0x19;
      local_5b8._12_4_ = *(undefined4 *)&pFVar25->field_0x1c;
      local_590 = 0;
      pSVar9 = (pBVar30->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      pIVar20 = (Interval *)local_5c8;
      local_598 = &local_658;
      (*pSVar9->_vptr_Statement[3])(pSVar9,pIVar20);
      pIVar21 = Environment::lookup<tcu::Matrix<float,3,3>>
                          ((Environment *)&local_658,
                           (pBVar30->m_variables).out1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                ((IVal *)pIVar20,&local_628,pIVar21);
      puVar23 = local_280;
      lVar24 = 0;
      do {
        lVar26 = 0;
        do {
          *(undefined8 *)(puVar23 + lVar26 + 0x10) = *(undefined8 *)((long)&pIVar20->m_hi + lVar26);
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_3>,_3> *)&pIVar20->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar26;
          dVar13 = *(double *)(pbVar2 + 8);
          *(undefined8 *)(puVar23 + lVar26) = *(undefined8 *)pbVar2;
          *(double *)((long)(puVar23 + lVar26) + 8) = dVar13;
          lVar26 = lVar26 + 0x48;
        } while (lVar26 != 0xd8);
        lVar24 = lVar24 + 1;
        puVar23 = puVar23 + 0x18;
        pIVar20 = pIVar20 + 1;
      } while (lVar24 != 3);
      bVar15 = contains<tcu::Matrix<float,3,3>>
                         ((IVal *)local_280,
                          local_5f8.out1.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar28);
      local_5c8._0_8_ = local_5c8 + 0x10;
      msg = (string *)local_5c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)msg,"Shader output 1 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(&local_2d0,bVar15,msg);
      pBVar30 = pBVar31;
      if ((TestLog *)local_5c8._0_8_ != (TestLog *)(local_5c8 + 0x10)) {
        operator_delete((void *)local_5c8._0_8_,
                        CONCAT44(local_5b8._M_allocated_capacity._4_4_,
                                 local_5b8._M_allocated_capacity._0_4_) + 1);
        pBVar30 = pBVar31;
      }
      pIVar21 = Environment::lookup<tcu::Matrix<float,3,3>>
                          ((Environment *)&local_658,
                           (pBVar30->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_3,_3>,_tcu::Matrix<tcu::Interval,_3,_3>_>::doConvert
                ((IVal *)msg,&local_628,pIVar21);
      ival = (Vector<float,_3> *)local_1a8;
      lVar24 = 0;
      do {
        lVar26 = 0;
        do {
          *(undefined8 *)((long)ival[1].m_data + lVar26 + 4) =
               *(undefined8 *)((long)&msg->field_2 + lVar26);
          puVar22 = (undefined8 *)((long)&(msg->_M_dataplus)._M_p + lVar26);
          uVar19 = puVar22[1];
          puVar3 = (undefined8 *)
                   ((long)((Vector<tcu::Vector<float,_3>,_3> *)ival->m_data)->m_data[0].m_data +
                   lVar26);
          *puVar3 = *puVar22;
          puVar3[1] = uVar19;
          lVar26 = lVar26 + 0x48;
        } while (lVar26 != 0xd8);
        lVar24 = lVar24 + 1;
        ival = ival + 2;
        msg = (string *)((msg->field_2)._M_local_buf + 8);
      } while (lVar24 != 3);
      bVar16 = contains<tcu::Matrix<float,3,3>>
                         ((IVal *)local_1a8,
                          local_5f8.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar28);
      local_5c8._0_8_ = local_5c8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5c8,"Shader output 0 is outside acceptable range","");
      bVar16 = tcu::ResultCollector::check(&local_2d0,bVar16,(string *)local_5c8);
      if ((TestLog *)local_5c8._0_8_ != (TestLog *)(local_5c8 + 0x10)) {
        operator_delete((void *)local_5c8._0_8_,
                        CONCAT44(local_5b8._M_allocated_capacity._4_4_,
                                 local_5b8._M_allocated_capacity._0_4_) + 1);
      }
      pFVar25 = local_668;
      if ((!bVar15 || !bVar16) &&
         (uVar18 = (int)local_670 + 1, local_670 = (ulong)uVar18, (int)uVar18 < 0x65)) {
        local_5c8._0_8_ = local_6a0;
        std::__cxx11::ostringstream::ostringstream(poVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar11 = (pBVar30->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.
                  m_ptr;
        val = (Matrix<float,_3,_3> *)local_430;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_440._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_440,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_440._0_8_,local_440._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Matrix<float,3,3>>
                  (&local_6c0,(shaderexecutor *)&local_628,
                   (FloatFormat *)
                   (local_358.in0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_6c0._M_dataplus._M_p,local_6c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
          operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_3,_3> *)local_440._0_8_ != (Matrix<float,_3,_3> *)local_430) {
          operator_delete((void *)local_440._0_8_,local_430._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar11 = (pBVar30->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.
                  m_ptr;
        pIVar21 = (IVal *)local_430;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_440._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_440,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_440._0_8_,local_440._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Matrix<float,3,3>>
                  (&local_6c0,(shaderexecutor *)&local_628,
                   (FloatFormat *)
                   (local_5f8.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28),
                   (Matrix<float,_3,_3> *)pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_6c0._M_dataplus._M_p,local_6c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,3>>
                  (&local_690,(shaderexecutor *)&local_628,(FloatFormat *)local_1a8,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_690._M_dataplus._M_p,local_690._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_690._M_dataplus._M_p != &local_690.field_2) {
          operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
          operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_440._0_8_ != (IVal *)local_430) {
          operator_delete((void *)local_440._0_8_,local_430._0_8_ + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar11 = (pBVar30->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Matrix<float,_3,_3>_>_>.
                  m_ptr;
        ival = (Vector<float,_3> *)local_430;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_440._0_8_ = ival;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_440,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_440._0_8_,local_440._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Matrix<float,3,3>>
                  (&local_6c0,(shaderexecutor *)&local_628,
                   (FloatFormat *)
                   (local_5f8.out1.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar28),(Matrix<float,_3,_3> *)ival)
        ;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_6c0._M_dataplus._M_p,local_6c0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,3,3>>
                  (&local_690,(shaderexecutor *)&local_628,(FloatFormat *)local_280,(IVal *)ival);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_690._M_dataplus._M_p,local_690._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_690._M_dataplus._M_p != &local_690.field_2) {
          operator_delete(local_690._M_dataplus._M_p,local_690.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_6c0._M_dataplus._M_p != &local_6c0.field_2) {
          operator_delete(local_6c0._M_dataplus._M_p,local_6c0.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_440._0_8_ != local_430) {
          operator_delete((void *)local_440._0_8_,local_430._0_8_ + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_550);
      }
      lVar28 = lVar28 + 1;
    } while (lVar28 != local_600);
    iVar17 = (int)local_670;
    if (iVar17 < 0x65) {
      if (iVar17 == 0) goto LAB_008f9b2a;
    }
    else {
      poVar5 = (ostringstream *)(local_5c8 + 8);
      local_5c8._0_8_ = local_6a0;
      std::__cxx11::ostringstream::ostringstream(poVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"(Skipped ",9);
      std::ostream::operator<<(poVar5,iVar17 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar5);
      std::ios_base::~ios_base(local_550);
    }
    poVar5 = (ostringstream *)(local_5c8 + 8);
    local_5c8._0_8_ = local_6a0;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::ostream::operator<<(poVar5,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_5c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_550);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5c8);
    std::ostream::operator<<(local_5c8,iVar17);
    pTVar29 = local_660;
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5c8);
    std::ios_base::~ios_base(local_558);
    local_5c8._0_8_ = local_5c8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_5c8," test failed. Check log for the details","");
    p_Var4 = (_Base_ptr)
             (CONCAT44(local_5c8._12_4_,local_5c8._8_4_) + CONCAT44(YStack_274,local_280._8_4_));
    uVar19 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ != &local_270) {
      uVar19 = local_270._M_allocated_capacity;
    }
    if ((ulong)uVar19 < p_Var4) {
      p_Var27 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_5c8 + 0x10)) {
        p_Var27 = (_Base_ptr)
                  CONCAT44(local_5b8._M_allocated_capacity._4_4_,
                           local_5b8._M_allocated_capacity._0_4_);
      }
      if (p_Var27 < p_Var4) goto LAB_008f9b18;
      puVar22 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_5c8,0,(char *)0x0,local_280._0_8_);
    }
    else {
LAB_008f9b18:
      puVar22 = (undefined8 *)std::__cxx11::string::_M_append(local_280,local_5c8._0_8_);
    }
    local_1a8._0_8_ = local_1a8 + 0x10;
    pdVar1 = (double *)(puVar22 + 2);
    if ((double *)*puVar22 == pdVar1) {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._24_4_ = *(undefined4 *)(puVar22 + 3);
      local_1a8._28_4_ = *(undefined4 *)((long)puVar22 + 0x1c);
    }
    else {
      local_1a8._16_8_ = *pdVar1;
      local_1a8._0_8_ = (double *)*puVar22;
    }
    local_1a8._8_8_ = puVar22[1];
    *puVar22 = pdVar1;
    puVar22[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar29->m_code = QP_TEST_RESULT_FAIL;
    (pTVar29->m_description)._M_dataplus._M_p = (pointer)&(pTVar29->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar29->m_description,local_1a8._0_8_,
               (undefined1 *)(local_1a8._8_8_ + local_1a8._0_8_));
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5c8._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_5c8 + 0x10)) {
      operator_delete((void *)local_5c8._0_8_,
                      CONCAT44(local_5b8._M_allocated_capacity._4_4_,
                               local_5b8._M_allocated_capacity._0_4_) + 1);
    }
    uVar19 = local_270._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ == &local_270) goto LAB_008f9d0f;
  }
  operator_delete((void *)local_280._0_8_,(ulong)((long)&((_Base_ptr)uVar19)->_M_color + 1));
LAB_008f9d0f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.m_message._M_dataplus._M_p != &local_2d0.m_message.field_2) {
    operator_delete(local_2d0.m_message._M_dataplus._M_p,
                    local_2d0.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.m_prefix._M_dataplus._M_p != &local_2d0.m_prefix.field_2) {
    operator_delete(local_2d0.m_prefix._M_dataplus._M_p,
                    local_2d0.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_658);
  if (local_5f8.out1.
      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f8.out1.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5f8.out1.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5f8.out1.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_5f8.out0.
      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5f8.out0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_5f8.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_5f8.out0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_358.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_358.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_358.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_358.in0.
      super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_358.in0.
                    super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_358.in0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_358.in0.
                          super__Vector_base<tcu::Matrix<float,_3,_3>,_std::allocator<tcu::Matrix<float,_3,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar29;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}